

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_RsbCost(Gia_RsbMan_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < p->vSets[0]->nSize; i = i + 1) {
    pVVar1 = Vec_WecEntry(p->vSets[0],i);
    pVVar2 = Vec_WecEntry(p->vSets[1],i);
    iVar3 = iVar3 + pVVar2->nSize * pVVar1->nSize;
  }
  return iVar3;
}

Assistant:

int Gia_RsbCost( Gia_RsbMan_t * p )
{
    Vec_Int_t * vLevel[2]; int i, Cost = 0;
    Vec_WecForEachLevelTwo( p->vSets[0], p->vSets[1], vLevel[0], vLevel[1], i )
        Cost += Vec_IntSize(vLevel[0]) * Vec_IntSize(vLevel[1]);
    return Cost;
}